

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

int __thiscall BinGE<0,_1,_1>::checkSatisfied(BinGE<0,_1,_1> *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  
  if ((this->super_Propagator).satisfied.v == '\0') {
    bVar3 = BoolView::isFalse(&this->r);
    if (bVar3) {
      iVar4 = 1;
    }
    else {
      iVar1 = (((this->y).var)->min).v;
      iVar4 = 3;
      iVar2 = (((this->x).var)->min).v;
      if (SBORROW4(iVar2,-iVar1) != iVar2 + iVar1 < 0) {
        return 3;
      }
    }
    Tchar::operator=(&(this->super_Propagator).satisfied,'\x01');
  }
  else {
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int checkSatisfied() override {
		if (satisfied) {
			return 1;
		}
		if (r.isFalse()) {
			satisfied = true;
			return 1;
		}
		if (x.getMin() >= y.getMax()) {
			satisfied = true;
		}
		return 3;
	}